

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<CylHead&,char_const(&)[8],int&,char_const(&)[29],int,char_const(&)[2]>
          (string *__return_storage_ptr__,util *this,CylHead *args,char (*args_1) [8],int *args_2,
          char (*args_3) [29],int *args_4,char (*args_5) [2])

{
  ostringstream ss;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::operator<<((ostream *)local_1a8,(CylHead *)this);
  std::operator<<((ostream *)local_1a8,(char *)args);
  std::ostream::operator<<(local_1a8,*(int *)*args_1);
  std::operator<<((ostream *)local_1a8,(char *)args_2);
  std::ostream::operator<<(local_1a8,*(int *)*args_3);
  std::operator<<((ostream *)local_1a8,(char *)args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}